

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuFloatFormat.cpp
# Opt level: O0

double __thiscall tcu::FloatFormat::ulp(FloatFormat *this,double x,double count)

{
  deBool dVar1;
  int iVar2;
  float fVar3;
  double dVar4;
  ScopedRoundingMode local_44;
  double dStack_40;
  ScopedRoundingMode ctx;
  double oneULP;
  double frac;
  double dStack_28;
  int exp;
  double count_local;
  double x_local;
  FloatFormat *this_local;
  
  frac._4_4_ = 0;
  dStack_28 = count;
  count_local = x;
  x_local = (double)this;
  dVar4 = deAbs(x);
  dVar4 = deFractExp(dVar4,(int *)((long)&frac + 4));
  dVar1 = deIsNaN(dVar4);
  if (dVar1 == 0) {
    iVar2 = deIsInf(dVar4);
    if (iVar2 == 0) {
      if ((dVar4 != 1.0) || (NAN(dVar4))) {
        if ((dVar4 == 0.0) && (!NAN(dVar4))) {
          frac._4_4_ = this->m_minExp;
        }
      }
      else {
        frac._4_4_ = frac._4_4_ + -1;
      }
      frac._4_4_ = de::max<int>(frac._4_4_,this->m_minExp);
      dStack_40 = deLdExp(1.0,frac._4_4_ - this->m_fractionBits);
      ScopedRoundingMode::ScopedRoundingMode(&local_44,DE_ROUNDINGMODE_TO_POSITIVE_INF);
      this_local = (FloatFormat *)(dStack_40 * dStack_28);
      ScopedRoundingMode::~ScopedRoundingMode(&local_44);
    }
    else {
      this_local = (FloatFormat *)deLdExp(1.0,this->m_maxExp - this->m_fractionBits);
    }
  }
  else {
    fVar3 = std::numeric_limits<float>::quiet_NaN();
    this_local = (FloatFormat *)(double)fVar3;
  }
  return (double)this_local;
}

Assistant:

double FloatFormat::ulp (double x, double count) const
{
	int				exp		= 0;
	const double	frac	= deFractExp(deAbs(x), &exp);

	if (deIsNaN(frac))
		return TCU_NAN;
	else if (deIsInf(frac))
		return deLdExp(1.0, m_maxExp - m_fractionBits);
	else if (frac == 1.0)
	{
		// Harrison's ULP: choose distance to closest (i.e. next lower) at binade
		// boundary.
		--exp;
	}
	else if (frac == 0.0)
		exp = m_minExp;

	// ULP cannot be lower than the smallest quantum.
	exp = de::max(exp, m_minExp);

	{
		const double		oneULP	= deLdExp(1.0, exp - m_fractionBits);
		ScopedRoundingMode	ctx		(DE_ROUNDINGMODE_TO_POSITIVE_INF);

		return oneULP * count;
	}
}